

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenio::load_node_call(tetgenio *this,FILE *infile,int markers,int uvflag,char *infilename)

{
  undefined1 auVar1 [16];
  byte bVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  pointparam *ppVar6;
  long lVar7;
  undefined4 in_register_0000000c;
  pointparam *infilename_00;
  tetgenio *ptVar8;
  tetgenio *ptVar9;
  char *__format;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char inputline [2048];
  tetgenio *local_868;
  int local_860;
  int local_85c;
  double local_858;
  pointparam *local_850;
  double local_848;
  FILE *local_840;
  char local_838 [2056];
  
  infilename_00 = (pointparam *)CONCAT44(in_register_0000000c,uvflag);
  iVar10 = this->numberofpoints;
  uVar11 = (ulong)iVar10;
  ptVar8 = (tetgenio *)(uVar11 * 0x18);
  if ((long)uVar11 < 0) {
    ptVar8 = (tetgenio *)0xffffffffffffffff;
  }
  local_840 = infile;
  pdVar4 = (double *)operator_new__((ulong)ptVar8);
  this->pointlist = pdVar4;
  if (0 < this->numberofpointattributes) {
    iVar3 = this->numberofpointattributes * iVar10;
    ptVar8 = (tetgenio *)((long)iVar3 * 8);
    if (iVar3 < 0) {
      ptVar8 = (tetgenio *)0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__((ulong)ptVar8);
    this->pointattributelist = pdVar4;
  }
  if (markers != 0) {
    ptVar8 = (tetgenio *)0xffffffffffffffff;
    if (-1 < iVar10) {
      ptVar8 = (tetgenio *)(uVar11 * 4);
    }
    piVar5 = (int *)operator_new__((ulong)ptVar8);
    this->pointmarkerlist = piVar5;
  }
  if (uvflag != 0) {
    infilename_00 = (pointparam *)0x18;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11;
    ptVar8 = (tetgenio *)0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      ptVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    ppVar6 = (pointparam *)operator_new__((ulong)ptVar8);
    this->pointparamlist = ppVar6;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  else {
    local_850 = (pointparam *)0x0;
    dVar15 = 0.0;
    lVar12 = 0;
    local_860 = markers;
    local_85c = uvflag;
    do {
      local_868 = (tetgenio *)readnumberline(ptVar8,local_838,local_840,(char *)infilename_00);
      if (this->useindex != 0) {
        if (dVar15 == 0.0) {
          lVar7 = strtol((char *)local_868,(char **)&local_868,0);
          if ((uint)lVar7 < 2) {
            this->firstnumber = (uint)lVar7;
          }
        }
        while ((uVar11 = (ulong)(byte)local_868->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          local_868 = (tetgenio *)((long)&local_868->firstnumber + 1);
        }
        do {
          bVar2 = (byte)uVar11;
          if (bVar2 < 0x2f) {
            if ((0x680000000001U >> (uVar11 & 0x3f) & 1) != 0) goto LAB_0010d76d;
            if (uVar11 == 0x23) {
              *(char *)&local_868->firstnumber = '\0';
              bVar2 = 0;
              goto LAB_0010d76d;
            }
          }
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d76d;
          uVar11 = (ulong)*(byte *)((long)&local_868->firstnumber + 1);
          local_868 = (tetgenio *)((long)&local_868->firstnumber + 1);
        } while( true );
      }
      bVar2 = (byte)local_868->firstnumber;
LAB_0010d76d:
      iVar10 = SUB84(dVar15,0);
      if (bVar2 == 0) {
        uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
        __format = "Error:  Point %d has no x coordinate.\n";
LAB_0010db94:
        printf(__format,uVar11);
        break;
      }
      dVar13 = strtod((char *)local_868,(char **)&local_868);
      ptVar8 = local_868;
      while ((uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
             ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
        ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
      }
      while (bVar2 = (byte)uVar11, 0x2e < bVar2) {
LAB_0010d7b2:
        if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d7ca;
        piVar5 = &ptVar8->firstnumber;
        ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
      }
      if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
        if (uVar11 != 0x23) goto LAB_0010d7b2;
        *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010db25:
        uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
        __format = "Error:  Point %d has no y coordinate.\n";
        goto LAB_0010db94;
      }
      local_868 = ptVar8;
      if (bVar2 == 0) goto LAB_0010db25;
LAB_0010d7ca:
      local_868 = ptVar8;
      local_858 = dVar13;
      dVar13 = strtod((char *)ptVar8,(char **)&local_868);
      dVar14 = 0.0;
      ptVar9 = local_868;
      if (this->mesh_dim == 3) {
        while ((ptVar8 = ptVar9, uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          ptVar9 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        }
        while (bVar2 = (byte)uVar11, 0x2e < bVar2) {
LAB_0010d819:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d831;
          piVar5 = &ptVar8->firstnumber;
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010d819;
          *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010db47:
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no z coordinate.\n";
          goto LAB_0010db94;
        }
        local_868 = ptVar8;
        if (bVar2 == 0) goto LAB_0010db47;
LAB_0010d831:
        local_868 = ptVar8;
        local_848 = dVar13;
        dVar14 = strtod((char *)ptVar8,(char **)&local_868);
        dVar13 = local_848;
      }
      pdVar4 = this->pointlist;
      pdVar4[(long)local_850] = local_858;
      pdVar4[(long)((long)local_850->uv + 1)] = dVar13;
      pdVar4[(long)((long)local_850->uv + 2)] = dVar14;
      infilename_00 = local_850;
      if (0 < this->numberofpointattributes) {
        lVar12 = (long)(int)lVar12;
        iVar10 = 0;
        local_858 = dVar15;
        ppVar6 = local_850;
        do {
          while ((ptVar8 = local_868, infilename_00 = (pointparam *)(ulong)(byte)ptVar8->firstnumber
                 , (pointparam *)0x2c < infilename_00 ||
                 ((0x100900000201U >> ((ulong)infilename_00 & 0x3f) & 1) == 0))) {
            local_868 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          }
          while (bVar2 = (byte)infilename_00, local_868 = ptVar8, 0x2e < bVar2) {
LAB_0010d8a7:
            infilename_00 = ppVar6;
            if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d8bb;
            piVar5 = &ptVar8->firstnumber;
            ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
            infilename_00 = (pointparam *)(ulong)*(byte *)((long)piVar5 + 1);
          }
          if ((0x680000000001U >> ((ulong)infilename_00 & 0x3f) & 1) == 0) {
            ppVar6 = infilename_00;
            if (infilename_00 != (pointparam *)0x23) goto LAB_0010d8a7;
            *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010d8cc:
            dVar15 = 0.0;
            goto LAB_0010d8cf;
          }
          if (bVar2 == 0) goto LAB_0010d8cc;
LAB_0010d8bb:
          dVar15 = strtod((char *)ptVar8,(char **)&local_868);
LAB_0010d8cf:
          this->pointattributelist[lVar12] = dVar15;
          lVar12 = lVar12 + 1;
          iVar10 = iVar10 + 1;
          dVar15 = local_858;
          ppVar6 = infilename_00;
        } while (iVar10 < this->numberofpointattributes);
      }
      if (local_860 != 0) {
        while ((ptVar8 = local_868, uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          local_868 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        }
        while (bVar2 = (byte)uVar11, local_868 = ptVar8, 0x2e < bVar2) {
LAB_0010d922:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d936;
          piVar5 = &ptVar8->firstnumber;
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010d922;
          *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010d949:
          iVar10 = 0;
          goto LAB_0010d94b;
        }
        if (bVar2 == 0) goto LAB_0010d949;
LAB_0010d936:
        lVar7 = strtol((char *)ptVar8,(char **)&local_868,0);
        iVar10 = (int)lVar7;
LAB_0010d94b:
        infilename_00 = (pointparam *)this->pointmarkerlist;
        *(int *)((long)infilename_00->uv + (long)dVar15 * 4) = iVar10;
      }
      ptVar9 = local_868;
      if (local_85c != 0) {
        while ((uVar11 = (ulong)(byte)ptVar9->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          ptVar9 = (tetgenio *)((long)&ptVar9->firstnumber + 1);
        }
        while( true ) {
          bVar2 = (byte)uVar11;
          iVar10 = SUB84(dVar15,0);
          if (bVar2 < 0x2f) break;
LAB_0010d993:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010d9ab;
          uVar11 = (ulong)*(byte *)((long)&ptVar9->firstnumber + 1);
          ptVar9 = (tetgenio *)((long)&ptVar9->firstnumber + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010d993;
          *(undefined1 *)&ptVar9->firstnumber = 0;
LAB_0010db36:
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no uv[0].\n";
          goto LAB_0010db94;
        }
        local_868 = ptVar9;
        if (bVar2 == 0) goto LAB_0010db36;
LAB_0010d9ab:
        local_868 = ptVar9;
        dVar13 = strtod((char *)ptVar9,(char **)&local_868);
        local_858 = (double)((long)dVar15 * 3);
        this->pointparamlist[(long)dVar15].uv[0] = dVar13;
        ptVar8 = local_868;
        while ((uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        }
        while (bVar2 = (byte)uVar11, 0x2e < bVar2) {
LAB_0010d9fa:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010da12;
          piVar5 = &ptVar8->firstnumber;
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010d9fa;
          *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010db58:
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no uv[1].\n";
          goto LAB_0010db94;
        }
        local_868 = ptVar8;
        if (bVar2 == 0) goto LAB_0010db58;
LAB_0010da12:
        local_868 = ptVar8;
        dVar13 = strtod((char *)ptVar8,(char **)&local_868);
        this->pointparamlist->uv[(long)local_858 + 1] = dVar13;
        ptVar8 = local_868;
        while ((uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        }
        while (bVar2 = (byte)uVar11, 0x2e < bVar2) {
LAB_0010da5e:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010da76;
          piVar5 = &ptVar8->firstnumber;
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010da5e;
          *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010db69:
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no tag.\n";
          goto LAB_0010db94;
        }
        local_868 = ptVar8;
        if (bVar2 == 0) goto LAB_0010db69;
LAB_0010da76:
        local_868 = ptVar8;
        lVar7 = strtol((char *)ptVar8,(char **)&local_868,0);
        *(int *)(this->pointparamlist->uv + (long)local_858 + 2) = (int)lVar7;
        ptVar8 = local_868;
        while ((uVar11 = (ulong)(byte)ptVar8->firstnumber, 0x2c < uVar11 ||
               ((0x100900000201U >> (uVar11 & 0x3f) & 1) == 0))) {
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
        }
        while (bVar2 = (byte)uVar11, 0x2e < bVar2) {
LAB_0010dac2:
          if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_0010dada;
          piVar5 = &ptVar8->firstnumber;
          ptVar8 = (tetgenio *)((long)&ptVar8->firstnumber + 1);
          uVar11 = (ulong)*(byte *)((long)piVar5 + 1);
        }
        if ((0x680000000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x23) goto LAB_0010dac2;
          *(undefined1 *)&ptVar8->firstnumber = 0;
LAB_0010db7a:
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no type.\n";
          goto LAB_0010db94;
        }
        local_868 = ptVar8;
        if (bVar2 == 0) goto LAB_0010db7a;
LAB_0010dada:
        local_868 = ptVar8;
        lVar7 = strtol((char *)ptVar8,(char **)&local_868,0);
        infilename_00 = this->pointparamlist;
        *(uint *)((long)infilename_00->uv + (long)local_858 * 8 + 0x14) = (uint)lVar7;
        if (2 < (uint)lVar7) {
          uVar11 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has an invalid type.\n";
          goto LAB_0010db94;
        }
      }
      local_850 = (pointparam *)((long)local_850->uv + 3);
      dVar15 = (double)((long)dVar15 + 1);
    } while ((long)dVar15 < (long)this->numberofpoints);
    iVar10 = SUB84(dVar15,0);
    uvflag = local_85c;
    markers = local_860;
  }
  iVar3 = this->numberofpoints;
  if (iVar10 < iVar3) {
    if (this->pointlist != (double *)0x0) {
      operator_delete__(this->pointlist);
    }
    this->pointlist = (double *)0x0;
    if (markers != 0) {
      if (this->pointmarkerlist != (int *)0x0) {
        operator_delete__(this->pointmarkerlist);
      }
      this->pointmarkerlist = (int *)0x0;
    }
    if (0 < this->numberofpointattributes) {
      if (this->pointattributelist != (double *)0x0) {
        operator_delete__(this->pointattributelist);
      }
      this->pointattributelist = (double *)0x0;
    }
    if (uvflag != 0) {
      if (this->pointparamlist != (pointparam *)0x0) {
        operator_delete__(this->pointparamlist);
      }
      this->pointparamlist = (pointparam *)0x0;
    }
    this->numberofpoints = 0;
  }
  return iVar3 <= iVar10;
}

Assistant:

bool tetgenio::load_node_call(FILE* infile, int markers, int uvflag, 
                              char* infilename)
{
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL x, y, z, attrib;
  int firstnode, currentmarker;
  int index, attribindex;
  int i, j;

  // Initialize 'pointlist', 'pointattributelist', and 'pointmarkerlist'.
  pointlist = new REAL[numberofpoints * 3];
  if (pointlist == (REAL *) NULL) {
    terminatetetgen(NULL, 1);
  }
  if (numberofpointattributes > 0) {
    pointattributelist = new REAL[numberofpoints * numberofpointattributes];
    if (pointattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (markers) {
    pointmarkerlist = new int[numberofpoints];
    if (pointmarkerlist == (int *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (uvflag) {
    pointparamlist = new pointparam[numberofpoints];
    if (pointparamlist == NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the point section.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberofpoints; i++) {
    stringptr = readnumberline(inputline, infile, infilename);
    if (useindex) {
      if (i == 0) {
        firstnode = (int) strtol (stringptr, &stringptr, 0);
        if ((firstnode == 0) || (firstnode == 1)) {
          firstnumber = firstnode;
        }
      }
      stringptr = findnextnumber(stringptr);
    } // if (useindex)
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no x coordinate.\n", firstnumber + i);
      break;
    }
    x = (REAL) strtod(stringptr, &stringptr);
    stringptr = findnextnumber(stringptr);
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no y coordinate.\n", firstnumber + i);
      break;
    }
    y = (REAL) strtod(stringptr, &stringptr);
    if (mesh_dim == 3) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no z coordinate.\n", firstnumber + i);
        break;
      }
      z = (REAL) strtod(stringptr, &stringptr);
    } else {
      z = 0.0; // mesh_dim == 2;
    }
    pointlist[index++] = x;
    pointlist[index++] = y;
    pointlist[index++] = z;
    // Read the point attributes.
    for (j = 0; j < numberofpointattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      pointattributelist[attribindex++] = attrib;
    }
    if (markers) {
      // Read a point marker.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        currentmarker = 0;
      } else {
        currentmarker = (int) strtol (stringptr, &stringptr, 0);
      }
      pointmarkerlist[i] = currentmarker;
    }
    if (uvflag) {
      // Read point paramteters.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[0].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[0] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[1].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[1] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no tag.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].tag = (int) strtol (stringptr, &stringptr, 0);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no type.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].type = (int) strtol (stringptr, &stringptr, 0);
      if ((pointparamlist[i].type < 0) || (pointparamlist[i].type > 2)) {
        printf("Error:  Point %d has an invalid type.\n", firstnumber + i);
        break;
      }
    }
  }
  if (i < numberofpoints) {
    // Failed to read points due to some error.
    delete [] pointlist;
    pointlist = (REAL *) NULL;
    if (markers) {
      delete [] pointmarkerlist;
      pointmarkerlist = (int *) NULL;
    }
    if (numberofpointattributes > 0) {
      delete [] pointattributelist;
      pointattributelist = (REAL *) NULL;
    }
    if (uvflag) {
      delete [] pointparamlist;
      pointparamlist = NULL;
    }
    numberofpoints = 0;
    return false;
  }
  return true;
}